

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

void __thiscall QPainter::~QPainter(QPainter *this)

{
  byte *pbVar1;
  undefined1 *puVar2;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var3;
  
  pbVar1 = &((this->d_ptr)._M_t.
             super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
             super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
             super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl)->field_0xf8;
  *pbVar1 = *pbVar1 | 2;
  _Var3._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((_Var3._M_head_impl)->engine)._M_t.
      super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
      super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
      super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0) {
    if (1 < (_Var3._M_head_impl)->refcount) {
      QPainterPrivate::detachPainterPrivate(_Var3._M_head_impl,this);
    }
  }
  else {
    end(this);
  }
  _Var3._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (QPainterPrivate *)0x0) {
    puVar2 = &(_Var3._M_head_impl)->field_0xf8;
    *puVar2 = *puVar2 & 0xfd;
  }
  std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::~unique_ptr(&this->d_ptr)
  ;
  return;
}

Assistant:

QPainter::~QPainter()
{
    d_ptr->inDestructor = true;
    QT_TRY {
        if (isActive())
            end();
        else if (d_ptr->refcount > 1)
            d_ptr->detachPainterPrivate(this);
    }